

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int lyxml_print_mem(char **strp,lyxml_elem *elem,int options)

{
  int iVar1;
  undefined1 auStack_58 [8];
  lyout out;
  
  iVar1 = 0;
  if (elem != (lyxml_elem *)0x0 && strp != (char **)0x0) {
    out.type = LYOUT_FD;
    out._4_4_ = 0;
    out.buf_len = 0;
    out.buf_size = 0;
    out.method.mem.size = 0;
    out.buffered = (char *)0x0;
    out.method.f = (FILE *)0x0;
    out.method.mem.len = 0;
    auStack_58 = (undefined1  [8])0x2;
    if ((options & 0x10U) == 0) {
      iVar1 = dump_elem((lyout *)auStack_58,elem,0,options,1);
    }
    else {
      iVar1 = dump_siblings((lyout *)auStack_58,elem,options);
    }
    *strp = (char *)out._0_8_;
  }
  return iVar1;
}

Assistant:

API int
lyxml_print_mem(char **strp, const struct lyxml_elem *elem, int options)
{
    struct lyout out;
    int r;

    if (!strp || !elem) {
        return 0;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_MEMORY;

    if (options & LYXML_PRINT_SIBLINGS) {
        r = dump_siblings(&out, elem, options);
    } else {
        r = dump_elem(&out, elem, 0, options, 1);
    }

    *strp = out.method.mem.buf;
    return r;
}